

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cidgload.c
# Opt level: O2

FT_Error cid_load_glyph(T1_Decoder_conflict decoder,FT_UInt glyph_index)

{
  FT_CharMap *ppFVar1;
  uint uVar2;
  FT_UInt offsize;
  FT_Face pFVar3;
  FT_Stream stream;
  FT_Incremental_InterfaceRec *pFVar4;
  long lVar5;
  FT_CharMap *ppFVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  FT_CharMap pFVar10;
  FT_CharMap pFVar11;
  FT_ULong FVar12;
  FT_Long FVar13;
  FT_Byte *buffer;
  FT_ULong FVar14;
  FT_ULong FVar15;
  FT_Fixed FVar16;
  FT_Fixed FVar17;
  ulong uVar18;
  ulong uVar19;
  undefined1 uVar20;
  FT_Memory memory;
  ulong count;
  int iVar21;
  FT_Error error;
  FT_Memory local_a20;
  FT_UInt local_a14;
  FT_ULong local_a10;
  FT_Incremental_InterfaceRec *local_a08;
  FT_ULong local_a00;
  FT_Long local_9f8;
  FT_Byte *p;
  FT_Data glyph_data;
  CFF_SubFontRec subfont;
  
  pFVar3 = (decoder->builder).face;
  stream = (FT_Stream)pFVar3[2].bbox.yMax;
  error = 0;
  memory = pFVar3->memory;
  local_9f8 = pFVar3[1].face_index;
  pFVar4 = pFVar3->internal->incremental_interface;
  if (pFVar4 == (FT_Incremental_InterfaceRec *)0x0) {
    iVar21 = *(int *)&pFVar3[2].field_0x3c + pFVar3[2].num_fixed_sizes;
    local_a08 = pFVar4;
    error = FT_Stream_Seek(stream,(FT_ULong)
                                  (pFVar3[2].style_name +
                                  (ulong)(iVar21 * glyph_index) + (long)pFVar3[2].generic.data));
    if ((error != 0) ||
       (local_a14 = glyph_index, error = FT_Stream_EnterFrame(stream,(ulong)(uint)(iVar21 * 2)),
       error != 0)) {
      uVar20 = 0;
      buffer = (FT_Byte *)0x0;
      goto LAB_001ec0de;
    }
    p = stream->cursor;
    uVar2 = pFVar3[2].num_fixed_sizes;
    local_a20 = memory;
    FVar14 = cid_get_offset(&p,uVar2);
    offsize = *(FT_UInt *)&pFVar3[2].field_0x3c;
    local_a00 = cid_get_offset(&p,offsize);
    p = p + uVar2;
    FVar15 = cid_get_offset(&p,offsize);
    FT_Stream_ExitFrame(stream);
    FVar12 = local_a00;
    local_a10 = FVar14;
    if ((FVar14 < (uint)pFVar3[2].num_charmaps) && (local_a00 <= FVar15 && FVar15 <= stream->size))
    {
      count = FVar15 - local_a00;
      if (count == 0) goto LAB_001ec217;
      buffer = (FT_Byte *)ft_mem_qalloc(local_a20,count,&error);
      if ((error == 0) &&
         (error = FT_Stream_ReadAt(stream,FVar12 + (long)pFVar3[2].generic.data,buffer,count),
         error == 0)) goto LAB_001ec26f;
    }
    else {
      error = 9;
LAB_001ec217:
      buffer = (FT_Byte *)0x0;
    }
LAB_001ec30a:
    uVar20 = 0;
    memory = local_a20;
    goto LAB_001ec0de;
  }
  error = (*pFVar4->funcs->get_glyph_data)(pFVar4->object,glyph_index,&glyph_data);
  if (error == 0) {
    uVar2 = pFVar3[2].num_fixed_sizes;
    count = (ulong)(glyph_data.length - uVar2);
    local_a20 = memory;
    local_a14 = glyph_index;
    if (glyph_data.length < uVar2) goto LAB_001ec0d8;
    p = glyph_data.pointer;
    local_a08 = pFVar4;
    local_a10 = cid_get_offset(&p,uVar2);
    buffer = (FT_Byte *)ft_mem_qalloc(local_a20,count,&error);
    if (error == 0) {
      memcpy(buffer,glyph_data.pointer + (uint)pFVar3[2].num_fixed_sizes,count);
    }
    (*local_a08->funcs->free_glyph_data)(local_a08->object,&glyph_data);
    memory = local_a20;
    if (error == 0) {
LAB_001ec26f:
      lVar5 = pFVar3[2].bbox.xMin;
      uVar19 = local_a10 * 0x150;
      decoder->num_subrs = *(FT_Int *)(lVar5 + local_a10 * 0x10);
      decoder->subrs = *(FT_Byte ***)(lVar5 + 8 + local_a10 * 0x10);
      decoder->subrs_len = (FT_UInt *)0x0;
      decoder->subrs_hash = (FT_Hash)0x0;
      ppFVar6 = pFVar3[2].charmaps;
      pFVar10 = ppFVar6[local_a10 * 0x2a + 0x21];
      pFVar11 = (ppFVar6 + local_a10 * 0x2a + 0x21)[1];
      ppFVar1 = ppFVar6 + local_a10 * 0x2a + 0x23;
      uVar7 = *(undefined4 *)((long)ppFVar1 + 4);
      uVar8 = *(undefined4 *)(ppFVar1 + 1);
      uVar9 = *(undefined4 *)((long)ppFVar1 + 0xc);
      *(undefined4 *)&(decoder->font_matrix).yx = *(undefined4 *)ppFVar1;
      *(undefined4 *)((long)&(decoder->font_matrix).yx + 4) = uVar7;
      *(undefined4 *)&(decoder->font_matrix).yy = uVar8;
      *(undefined4 *)((long)&(decoder->font_matrix).yy + 4) = uVar9;
      (decoder->font_matrix).xx = (FT_Fixed)pFVar10;
      (decoder->font_matrix).xy = (FT_Fixed)pFVar11;
      pFVar10 = (ppFVar6 + local_a10 * 0x2a + 0x25)[1];
      (decoder->font_offset).x = (FT_Pos)ppFVar6[local_a10 * 0x2a + 0x25];
      (decoder->font_offset).y = (FT_Pos)pFVar10;
      uVar2 = *(uint *)((long)ppFVar6 + uVar19 + 4);
      decoder->lenIV = uVar2;
      uVar18 = 0;
      if (-1 < (int)uVar2) {
        uVar18 = (ulong)uVar2;
      }
      local_a10 = count - uVar18;
      if (count < uVar18) {
        error = 9;
        goto LAB_001ec30a;
      }
      if (-1 < (int)uVar2) {
        local_a00 = uVar19;
        (**(code **)(local_9f8 + 0x20))(buffer,count,0x10ea);
        uVar19 = local_a00;
      }
      FVar13 = local_9f8;
      if ((decoder->builder).metrics_only == '\0') {
        (**(code **)(local_9f8 + 0x30))(&glyph_data,decoder,1);
        (**(code **)(FVar13 + 0x38))(pFVar3,(long)ppFVar6 + uVar19);
        FVar12 = local_a10;
        error = (**(code **)(*(long *)(FVar13 + 0x18) + 0x18))
                          (&glyph_data,buffer + uVar18,local_a10);
        if ((char)error != -0x5c) goto LAB_001ec3e4;
        *(undefined1 *)&(decoder->builder).glyph[1].library = 0;
        error = (**(code **)(*(long *)(FVar13 + 0x18) + 0x18))(&glyph_data,buffer + uVar18,FVar12);
        uVar20 = 1;
      }
      else {
        error = (**(code **)(*(long *)(local_9f8 + 0x18) + 0x10))
                          (decoder,buffer + uVar18,(int)count - (int)uVar18);
LAB_001ec3e4:
        uVar20 = 0;
      }
      pFVar4 = local_a08;
      memory = local_a20;
      if (((local_a08 != (FT_Incremental_InterfaceRec *)0x0) && (error == 0)) &&
         (local_a08->funcs->get_glyph_metrics != (FT_Incremental_GetGlyphMetricsFunc)0x0)) {
        FVar16 = FT_RoundFix((decoder->builder).left_bearing.x);
        glyph_data.pointer = (FT_Byte *)(FVar16 >> 0x10);
        glyph_data.length = 0;
        glyph_data._12_4_ = 0;
        FVar16 = FT_RoundFix((decoder->builder).advance.x);
        FVar17 = FT_RoundFix((decoder->builder).advance.y);
        error = (*pFVar4->funcs->get_glyph_metrics)
                          (pFVar4->object,local_a14,'\0',(FT_Incremental_MetricsRec *)&glyph_data);
        (decoder->builder).left_bearing.x = (long)glyph_data.pointer << 0x10;
        (decoder->builder).advance.x = (FVar16 >> 0x10) << 0x10;
        (decoder->builder).advance.y = (FVar17 >> 0x10) << 0x10;
      }
      goto LAB_001ec0de;
    }
  }
  else {
LAB_001ec0d8:
    buffer = (FT_Byte *)0x0;
  }
  uVar20 = 0;
LAB_001ec0de:
  ft_mem_free(memory,buffer);
  *(undefined1 *)((long)&(decoder->builder).glyph[1].library + 1) = uVar20;
  return error;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  cid_load_glyph( T1_Decoder  decoder,
                  FT_UInt     glyph_index )
  {
    CID_Face       face = (CID_Face)decoder->builder.face;
    CID_FaceInfo   cid  = &face->cid;
    FT_Byte*       p;
    FT_ULong       fd_select;
    FT_Stream      stream       = face->cid_stream;
    FT_Error       error        = FT_Err_Ok;
    FT_Byte*       charstring   = NULL;
    FT_Memory      memory       = face->root.memory;
    FT_ULong       glyph_length = 0;
    PSAux_Service  psaux        = (PSAux_Service)face->psaux;

    FT_Bool  force_scaling = FALSE;

#ifdef FT_CONFIG_OPTION_INCREMENTAL
    FT_Incremental_InterfaceRec  *inc =
                                   face->root.internal->incremental_interface;
#endif


    FT_TRACE1(( "cid_load_glyph: glyph index %u\n", glyph_index ));

#ifdef FT_CONFIG_OPTION_INCREMENTAL

    /* For incremental fonts get the character data using */
    /* the callback function.                             */
    if ( inc )
    {
      FT_Data  glyph_data;


      error = inc->funcs->get_glyph_data( inc->object,
                                          glyph_index, &glyph_data );
      if ( error || glyph_data.length < cid->fd_bytes )
        goto Exit;

      p         = (FT_Byte*)glyph_data.pointer;
      fd_select = cid_get_offset( &p, cid->fd_bytes );

      glyph_length = glyph_data.length - cid->fd_bytes;

      if ( !FT_QALLOC( charstring, glyph_length ) )
        FT_MEM_COPY( charstring, glyph_data.pointer + cid->fd_bytes,
                     glyph_length );

      inc->funcs->free_glyph_data( inc->object, &glyph_data );

      if ( error )
        goto Exit;
    }

    else

#endif /* FT_CONFIG_OPTION_INCREMENTAL */

    /* For ordinary fonts read the CID font dictionary index */
    /* and charstring offset from the CIDMap.                */
    {
      FT_UInt   entry_len = cid->fd_bytes + cid->gd_bytes;
      FT_ULong  off1, off2;


      if ( FT_STREAM_SEEK( cid->data_offset + cid->cidmap_offset +
                           glyph_index * entry_len )               ||
           FT_FRAME_ENTER( 2 * entry_len )                         )
        goto Exit;

      p         = (FT_Byte*)stream->cursor;
      fd_select = cid_get_offset( &p, cid->fd_bytes );
      off1      = cid_get_offset( &p, cid->gd_bytes );
      p        += cid->fd_bytes;
      off2      = cid_get_offset( &p, cid->gd_bytes );
      FT_FRAME_EXIT();

      if ( fd_select >= cid->num_dicts ||
           off2 > stream->size         ||
           off1 > off2                 )
      {
        FT_TRACE0(( "cid_load_glyph: invalid glyph stream offsets\n" ));
        error = FT_THROW( Invalid_Offset );
        goto Exit;
      }

      glyph_length = off2 - off1;

      if ( glyph_length == 0                             ||
           FT_QALLOC( charstring, glyph_length )         ||
           FT_STREAM_READ_AT( cid->data_offset + off1,
                              charstring, glyph_length ) )
        goto Exit;
    }

    /* Now set up the subrs array and parse the charstrings. */
    {
      CID_FaceDict  dict;
      CID_Subrs     cid_subrs = face->subrs + fd_select;
      FT_UInt       cs_offset;


      /* Set up subrs */
      decoder->num_subrs  = cid_subrs->num_subrs;
      decoder->subrs      = cid_subrs->code;
      decoder->subrs_len  = 0;
      decoder->subrs_hash = NULL;

      /* Set up font matrix */
      dict                 = cid->font_dicts + fd_select;

      decoder->font_matrix = dict->font_matrix;
      decoder->font_offset = dict->font_offset;
      decoder->lenIV       = dict->private_dict.lenIV;

      /* Decode the charstring. */

      /* Adjustment for seed bytes. */
      cs_offset = decoder->lenIV >= 0 ? (FT_UInt)decoder->lenIV : 0;
      if ( cs_offset > glyph_length )
      {
        FT_TRACE0(( "cid_load_glyph: invalid glyph stream offsets\n" ));
        error = FT_THROW( Invalid_Offset );
        goto Exit;
      }

      /* Decrypt only if lenIV >= 0. */
      if ( decoder->lenIV >= 0 )
        psaux->t1_decrypt( charstring, glyph_length, 4330 );

      /* choose which renderer to use */
#ifdef T1_CONFIG_OPTION_OLD_ENGINE
      if ( ( (PS_Driver)FT_FACE_DRIVER( face ) )->hinting_engine ==
               FT_HINTING_FREETYPE                                  ||
           decoder->builder.metrics_only                            )
        error = psaux->t1_decoder_funcs->parse_charstrings_old(
                  decoder,
                  charstring + cs_offset,
                  glyph_length - cs_offset );
#else
      if ( decoder->builder.metrics_only )
        error = psaux->t1_decoder_funcs->parse_metrics(
                  decoder,
                  charstring + cs_offset,
                  glyph_length - cs_offset );
#endif
      else
      {
        PS_Decoder      psdecoder;
        CFF_SubFontRec  subfont;


        psaux->ps_decoder_init( &psdecoder, decoder, TRUE );

        psaux->t1_make_subfont( FT_FACE( face ),
                                &dict->private_dict,
                                &subfont );
        psdecoder.current_subfont = &subfont;

        error = psaux->t1_decoder_funcs->parse_charstrings(
                  &psdecoder,
                  charstring + cs_offset,
                  glyph_length - cs_offset );

        /* Adobe's engine uses 16.16 numbers everywhere;              */
        /* as a consequence, glyphs larger than 2000ppem get rejected */
        if ( FT_ERR_EQ( error, Glyph_Too_Big ) )
        {
          /* this time, we retry unhinted and scale up the glyph later on */
          /* (the engine uses and sets the hardcoded value 0x10000 / 64 = */
          /* 0x400 for both `x_scale' and `y_scale' in this case)         */
          ((CID_GlyphSlot)decoder->builder.glyph)->hint = FALSE;

          force_scaling = TRUE;

          error = psaux->t1_decoder_funcs->parse_charstrings(
                    &psdecoder,
                    charstring + cs_offset,
                    glyph_length - cs_offset );
        }
      }
    }

#ifdef FT_CONFIG_OPTION_INCREMENTAL

    /* Incremental fonts can optionally override the metrics. */
    if ( !error && inc && inc->funcs->get_glyph_metrics )
    {
      FT_Incremental_MetricsRec  metrics;


      metrics.bearing_x = FIXED_TO_INT( decoder->builder.left_bearing.x );
      metrics.bearing_y = 0;
      metrics.advance   = FIXED_TO_INT( decoder->builder.advance.x );
      metrics.advance_v = FIXED_TO_INT( decoder->builder.advance.y );

      error = inc->funcs->get_glyph_metrics( inc->object,
                                             glyph_index, FALSE, &metrics );

      decoder->builder.left_bearing.x = INT_TO_FIXED( metrics.bearing_x );
      decoder->builder.advance.x      = INT_TO_FIXED( metrics.advance );
      decoder->builder.advance.y      = INT_TO_FIXED( metrics.advance_v );
    }

#endif /* FT_CONFIG_OPTION_INCREMENTAL */

  Exit:
    FT_FREE( charstring );

    ((CID_GlyphSlot)decoder->builder.glyph)->scaled = force_scaling;

    return error;
  }